

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# resolve.c
# Opt level: O0

int resolve_base_ident(lys_module *module,lys_ident *ident,char *basename,char *parent,
                      lys_type *type,unres_schema *unres)

{
  byte bVar1;
  ly_ctx *ctx_00;
  lys_ident *plVar2;
  int iVar3;
  void *pvVar4;
  lys_module *plVar5;
  char *local_a0;
  char *local_88;
  ly_ctx *ctx;
  lys_module *mod;
  lys_ident **pplStack_60;
  uint16_t flags;
  lys_ident **ret;
  lys_ident *target;
  int rc;
  int mod_name_len;
  char *name;
  unres_schema *unres_local;
  lys_type *type_local;
  char *parent_local;
  char *basename_local;
  lys_ident *ident_local;
  lys_module *module_local;
  
  target._4_4_ = 0;
  ctx_00 = module->ctx;
  name = (char *)unres;
  unres_local = (unres_schema *)type;
  type_local = (lys_type *)parent;
  parent_local = basename;
  basename_local = (char *)ident;
  ident_local = (lys_ident *)module;
  if (((ident == (lys_ident *)0x0) || (type != (lys_type *)0x0)) &&
     ((ident != (lys_ident *)0x0 || (type == (lys_type *)0x0)))) {
    __assert_fail("(ident && !type) || (!ident && type)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/stritzinger[P]libyang/src/resolve.c"
                  ,0x166c,
                  "int resolve_base_ident(const struct lys_module *, struct lys_ident *, const char *, const char *, struct lys_type *, struct unres_schema *)"
                 );
  }
  if (type == (lys_type *)0x0) {
    pplStack_60 = (lys_ident **)&ret;
    mod._6_2_ = ident->flags;
    ctx = (ly_ctx *)ident->module;
  }
  else {
    (type->info).bits.count = (type->info).bits.count + 1;
    pvVar4 = ly_realloc((type->info).bits.bit,(ulong)(type->info).bits.count << 3);
    *(void **)&unres_local->count = pvVar4;
    if (*(long *)&unres_local->count == 0) {
      ly_log(ctx_00,LY_LLERR,LY_EMEM,"Memory allocation failed (%s()).","resolve_base_ident");
      return -1;
    }
    pplStack_60 = (lys_ident **)
                  (*(long *)&unres_local->count + (ulong)(*(int *)&unres_local[1].item - 1) * 8);
    mod._6_2_ = *(uint16_t *)(unres_local->module + 3);
    ctx = (ly_ctx *)unres_local->module[6];
  }
  *pplStack_60 = (lys_ident *)0x0;
  _rc = strchr(parent_local,0x3a);
  if (_rc == (char *)0x0) {
    _rc = parent_local;
  }
  else {
    target._4_4_ = (int)_rc - (int)parent_local;
    _rc = _rc + 1;
    iVar3 = strncmp(parent_local,ident_local->dsc,(long)target._4_4_);
    if ((iVar3 == 0) && (ident_local->dsc[target._4_4_] == '\0')) {
      target._4_4_ = 0;
    }
  }
  if (target._4_4_ == 0) {
    local_88 = (char *)0x0;
  }
  else {
    local_88 = parent_local;
  }
  ident_local = (lys_ident *)
                lyp_get_module((lys_module *)ident_local,(char *)0x0,0,local_88,target._4_4_,0);
  if ((lys_module *)ident_local == (lys_module *)0x0) {
    ly_vlog(ctx_00,LYE_INMOD,LY_VLOG_NONE,(void *)0x0,parent_local);
    module_local._4_4_ = -1;
  }
  else {
    target._0_4_ = resolve_base_ident_sub
                             ((lys_module *)ident_local,(lys_ident *)basename_local,_rc,
                              (unres_schema *)name,pplStack_60);
    if ((int)target == 0) {
      if (*pplStack_60 == (lys_ident *)0x0) {
        __assert_fail("*ret",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/stritzinger[P]libyang/src/resolve.c"
                      ,0x1699,
                      "int resolve_base_ident(const struct lys_module *, struct lys_ident *, const char *, const char *, struct lys_type *, struct unres_schema *)"
                     );
      }
      if (basename_local == (char *)0x0) {
        local_a0 = "of type";
      }
      else {
        local_a0 = *(char **)basename_local;
      }
      iVar3 = lyp_check_status(mod._6_2_,(lys_module *)ctx,local_a0,(*pplStack_60)->flags,
                               (*pplStack_60)->module,(*pplStack_60)->name,(lys_node *)0x0);
      if (iVar3 == 0) {
        if (basename_local != (char *)0x0) {
          plVar2 = *pplStack_60;
          bVar1 = basename_local[0x1f];
          basename_local[0x1f] = bVar1 + 1;
          *(lys_ident **)(*(long *)(basename_local + 0x38) + (ulong)bVar1 * 8) = plVar2;
          plVar5 = lys_main_module((lys_module *)ctx);
          if ((*(ushort *)&plVar5->field_0x40 >> 7 & 1) != 0) {
            resolve_identity_backlink_update((lys_ident *)basename_local,*pplStack_60);
          }
        }
      }
      else {
        target._0_4_ = -1;
      }
    }
    else if (((int)target == 1) &&
            (ly_vlog(ctx_00,LYE_INRESOLV,LY_VLOG_NONE,(void *)0x0,type_local,parent_local),
            unres_local != (unres_schema *)0x0)) {
      *(int *)&unres_local[1].item = *(int *)&unres_local[1].item + -1;
    }
    module_local._4_4_ = (int)target;
  }
  return module_local._4_4_;
}

Assistant:

static int
resolve_base_ident(const struct lys_module *module, struct lys_ident *ident, const char *basename, const char *parent,
                   struct lys_type *type, struct unres_schema *unres)
{
    const char *name;
    int mod_name_len = 0, rc;
    struct lys_ident *target, **ret;
    uint16_t flags;
    struct lys_module *mod;
    struct ly_ctx *ctx = module->ctx;

    assert((ident && !type) || (!ident && type));

    if (!type) {
        /* have ident to resolve */
        ret = &target;
        flags = ident->flags;
        mod = ident->module;
    } else {
        /* have type to fill */
        ++type->info.ident.count;
        type->info.ident.ref = ly_realloc(type->info.ident.ref, type->info.ident.count * sizeof *type->info.ident.ref);
        LY_CHECK_ERR_RETURN(!type->info.ident.ref, LOGMEM(ctx), -1);

        ret = &type->info.ident.ref[type->info.ident.count - 1];
        flags = type->parent->flags;
        mod = type->parent->module;
    }
    *ret = NULL;

    /* search for the base identity */
    name = strchr(basename, ':');
    if (name) {
        /* set name to correct position after colon */
        mod_name_len = name - basename;
        name++;

        if (!strncmp(basename, module->name, mod_name_len) && !module->name[mod_name_len]) {
            /* prefix refers to the current module, ignore it */
            mod_name_len = 0;
        }
    } else {
        name = basename;
    }

    /* get module where to search */
    module = lyp_get_module(module, NULL, 0, mod_name_len ? basename : NULL, mod_name_len, 0);
    if (!module) {
        /* identity refers unknown data model */
        LOGVAL(ctx, LYE_INMOD, LY_VLOG_NONE, NULL, basename);
        return -1;
    }

    /* search in the identified module ... */
    rc = resolve_base_ident_sub(module, ident, name, unres, ret);
    if (!rc) {
        assert(*ret);

        /* check status */
        if (lyp_check_status(flags, mod, ident ? ident->name : "of type",
                             (*ret)->flags, (*ret)->module, (*ret)->name, NULL)) {
            rc = -1;
        } else if (ident) {
            ident->base[ident->base_size++] = *ret;
            if (lys_main_module(mod)->implemented) {
                /* in case of the implemented identity, maintain backlinks to it
                 * from the base identities to make it available when resolving
                 * data with the identity values (not implemented identity is not
                 * allowed as an identityref value). */
                resolve_identity_backlink_update(ident, *ret);
            }
        }
    } else if (rc == EXIT_FAILURE) {
        LOGVAL(ctx, LYE_INRESOLV, LY_VLOG_NONE, NULL, parent, basename);
        if (type) {
            --type->info.ident.count;
        }
    }

    return rc;
}